

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<unsigned_short,_true,_short> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  undefined2 uVar2;
  pointer pCVar3;
  ushort uVar4;
  ushort uVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar4 = (state->state).maximum;
    uVar5 = *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 8) = uVar5;
    uVar5 = *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (uVar4 < uVar5) {
      uVar4 = uVar5;
    }
    *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = uVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    uVar2 = (state->state).minimum;
    uVar4 = *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    if ((ushort)uVar2 <= uVar4) {
      uVar4 = uVar2;
    }
    *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 8) = uVar4;
    uVar4 = *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    uVar5 = uVar2;
    if ((ushort)uVar2 < uVar4) {
      uVar5 = uVar4;
    }
    *(ushort *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = uVar5;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}